

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoscbundle.cpp
# Opt level: O1

void __thiscall QOscBundle::QOscBundle(QOscBundle *this,QByteArray *data)

{
  uint uVar1;
  QDebug QVar2;
  undefined8 uVar3;
  int *piVar4;
  Data *pDVar5;
  bool bVar6;
  QDebug QVar7;
  bool bVar8;
  char cVar9;
  qsizetype qVar10;
  long lVar11;
  uint uVar12;
  char *pcVar13;
  uint uVar14;
  undefined8 *puVar15;
  QOscBundle *pQVar16;
  uint uVar17;
  uint uVar18;
  long in_FS_OFFSET;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QOscMessage subMessage;
  undefined1 local_f8 [20];
  undefined4 uStack_e4;
  QOscBundle *pQStack_e0;
  Data *local_d8;
  QArrayDataPointer<QOscMessage> QStack_d0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  Latin1Content LStack_a8;
  undefined4 uStack_a4;
  char *local_a0;
  QByteArray local_98;
  QByteArray local_78;
  QDebug local_58;
  undefined8 uStack_50;
  Data *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_isValid = false;
  this->m_immediate = false;
  this->m_timeEpoch = 0;
  this->m_timePico = 0;
  (this->m_bundles).d.d = (Data *)0x0;
  (this->m_bundles).d.ptr = (QOscBundle *)0x0;
  (this->m_bundles).d.size = 0;
  (this->m_messages).d.d = (Data *)0x0;
  (this->m_messages).d.ptr = (QOscMessage *)0x0;
  (this->m_messages).d.size = 0;
  lcTuioBundle();
  if (((byte)lcTuioBundle::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_f8[0] = true;
    local_f8[1] = false;
    local_f8._2_2_ = 0;
    local_f8._4_4_ = 0;
    local_f8._8_4_ = 0;
    local_f8._12_4_ = 0;
    local_f8._16_4_ = 0;
    uStack_e4 = 0;
    pQStack_e0 = (QOscBundle *)lcTuioBundle::category.name;
    QMessageLogger::debug();
    QByteArray::toHex((char)&local_b8);
    puVar15 = (undefined8 *)CONCAT44(uStack_ac,uStack_b0);
    if (puVar15 == (undefined8 *)0x0) {
      puVar15 = &QByteArray::_empty;
    }
    QDebug::putByteArray((char *)&local_58,(ulong)puVar15,LStack_a8);
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    piVar4 = (int *)CONCAT44(uStack_b4,local_b8);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_b4,local_b8),1,0x10);
      }
    }
    QDebug::~QDebug(&local_58);
  }
  local_58.stream = (Stream *)0x0;
  uStack_50._0_4_ = 0;
  uStack_50._4_4_ = 0;
  local_48 = (Data *)0x0;
  pcVar13 = (data->d).ptr;
  qVar10 = (data->d).size;
  local_f8._0_4_ = (undefined4)qVar10;
  local_f8._4_4_ = (undefined4)((ulong)qVar10 >> 0x20);
  local_f8._8_4_ = SUB84(pcVar13,0);
  local_f8._12_4_ = (undefined4)((ulong)pcVar13 >> 0x20);
  qVar10 = QByteArrayView::indexOf((QByteArrayView *)local_f8,'\0',0);
  QVar2.stream = local_58.stream;
  uVar12 = (uint)qVar10;
  if ((int)uVar12 < 0) {
    uVar18 = (uint)(data->d).size;
    local_58.stream = (Stream *)0x0;
    uStack_50._0_4_ = 0;
    uStack_50._4_4_ = 0;
    local_48 = (Data *)0x0;
    if ((QArrayData *)QVar2.stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)QVar2.stream = *(int *)QVar2.stream + -1;
      UNLOCK();
      if (*(int *)QVar2.stream == 0) {
        QArrayData::deallocate((QArrayData *)QVar2.stream,1,0x10);
      }
    }
  }
  else {
    QByteArray::mid((longlong)local_f8,(longlong)data);
    QVar7.stream = local_58.stream;
    QVar2.stream = (Stream *)CONCAT44(local_f8._4_4_,local_f8._0_4_);
    uVar3._4_4_ = local_f8._12_4_;
    uVar3._0_4_ = local_f8._8_4_;
    local_f8._0_4_ = SUB84(local_58.stream,0);
    local_f8._4_4_ = (undefined4)((ulong)local_58.stream >> 0x20);
    pDVar5 = (Data *)CONCAT44(uStack_e4,local_f8._16_4_);
    local_f8._8_4_ = (undefined4)uStack_50;
    local_f8._12_4_ = SUB84(uStack_50,4);
    local_f8._16_4_ = SUB84(local_48,0);
    uStack_e4 = (undefined4)((ulong)local_48 >> 0x20);
    uStack_50 = uVar3;
    local_48 = pDVar5;
    if ((QArrayData *)local_58.stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.stream = *(int *)local_58.stream + -1;
      UNLOCK();
      if (*(int *)local_58.stream == 0) {
        local_58.stream = QVar2.stream;
        QArrayData::deallocate((QArrayData *)QVar7.stream,1,0x10);
        QVar2.stream = local_58.stream;
      }
    }
    local_58.stream = QVar2.stream;
    uVar18 = (uVar12 & 0x7ffffffc) + 4;
  }
  if (-1 < (int)uVar12) {
    local_f8[0] = true;
    local_f8[1] = true;
    local_f8._2_2_ = 0x11;
    local_f8._4_4_ = 0;
    pQVar16 = (QOscBundle *)&local_58;
    bVar8 = operator!=((QByteArray *)pQVar16,(char **)local_f8);
    if (((!bVar8) && (lVar11 = (data->d).size, uVar18 <= (uint)lVar11)) &&
       (7 < (long)(lVar11 - (ulong)uVar18))) {
      pcVar13 = (data->d).ptr;
      lVar11 = (data->d).size;
      if (pcVar13 == (char *)0x0) {
        pcVar13 = (char *)&QByteArray::_empty;
      }
      uVar12 = *(uint *)(pcVar13 + uVar18);
      uVar14 = *(uint *)(pcVar13 + (uVar18 + 4));
      uVar18 = uVar18 + 8;
      bVar8 = uVar14 == 0x1000000 && uVar12 == 0;
      if (uVar18 < (uint)lVar11) {
        uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18
        ;
        uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18
        ;
        while (3 < (long)(lVar11 - (ulong)uVar18)) {
          pcVar13 = (data->d).ptr;
          if (pcVar13 == (char *)0x0) {
            pcVar13 = (char *)&QByteArray::_empty;
          }
          uVar1 = *(uint *)(pcVar13 + uVar18);
          uVar17 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
          if ((long)(lVar11 - (ulong)(uVar18 + 4)) < (long)(ulong)uVar17) break;
          if (uVar1 == 0) {
            lcTuioBundle();
            if (((byte)lcTuioBundle::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1
                ) != 0) {
              QOscBundle(pQVar16);
            }
            this->m_isValid = true;
            this->m_immediate = bVar8;
            this->m_timeEpoch = uVar12;
            this->m_timePico = uVar14;
            break;
          }
          local_78.d.size = -0x5555555555555556;
          local_78.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_78.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
          QByteArray::mid((longlong)&local_78,(longlong)data);
          local_98.d.size = -0x5555555555555556;
          local_98.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_98.d.ptr = (storage_type *)0xaaaaaaaaaaaaaaaa;
          QByteArray::QByteArray(&local_98,"#bundle",8);
          if (((QOscBundle *)local_78.d.size == (QOscBundle *)0x0) || (*local_78.d.ptr != '/')) {
            QVar19.m_data = local_78.d.ptr;
            QVar19.m_size = local_78.d.size;
            QVar20.m_data = local_98.d.ptr;
            QVar20.m_size = local_98.d.size;
            pQVar16 = (QOscBundle *)local_78.d.size;
            cVar9 = QtPrivate::startsWith(QVar19,QVar20);
            if (cVar9 == '\0') {
              lcTuioBundle();
              if (((byte)lcTuioBundle::category.field_2.bools.enabledWarning._q_value._M_base._M_i &
                  1) != 0) {
                QOscBundle(pQVar16);
              }
              goto LAB_00105d4d;
            }
            QStack_d0.ptr = (QOscMessage *)0xaaaaaaaaaaaaaaaa;
            QStack_d0.size = -0x5555555555555556;
            local_d8 = (Data *)0xaaaaaaaaaaaaaaaa;
            QStack_d0.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_f8._16_4_ = 0xaaaaaaaa;
            uStack_e4 = 0xaaaaaaaa;
            pQStack_e0 = (QOscBundle *)0xaaaaaaaaaaaaaaaa;
            local_f8[0] = true;
            local_f8[1] = true;
            local_f8._2_2_ = 0xaaaa;
            local_f8._4_4_ = 0xaaaaaaaa;
            local_f8._8_4_ = 0xaaaaaaaa;
            local_f8._12_4_ = 0xaaaaaaaa;
            QOscBundle((QOscBundle *)local_f8,&local_78);
            if ((bool)local_f8[0] == true) {
              this->m_isValid = true;
              this->m_immediate = bVar8;
              this->m_timeEpoch = uVar12;
              this->m_timePico = uVar14;
              QtPrivate::QMovableArrayOps<QOscBundle>::emplace<QOscBundle_const&>
                        ((QMovableArrayOps<QOscBundle> *)&this->m_bundles,(this->m_bundles).d.size,
                         (QOscBundle *)local_f8);
              QList<QOscBundle>::end(&this->m_bundles);
            }
            QArrayDataPointer<QOscMessage>::~QArrayDataPointer(&QStack_d0);
            pQVar16 = (QOscBundle *)(local_f8 + 0x10);
            QArrayDataPointer<QOscBundle>::~QArrayDataPointer
                      ((QArrayDataPointer<QOscBundle> *)pQVar16);
          }
          else {
            QStack_d0.ptr = (QOscMessage *)0xaaaaaaaaaaaaaaaa;
            local_d8 = (Data *)0xaaaaaaaaaaaaaaaa;
            QStack_d0.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_f8._16_4_ = 0xaaaaaaaa;
            uStack_e4 = 0xaaaaaaaa;
            pQStack_e0 = (QOscBundle *)0xaaaaaaaaaaaaaaaa;
            local_f8[0] = true;
            local_f8[1] = true;
            local_f8._2_2_ = 0xaaaa;
            local_f8._4_4_ = 0xaaaaaaaa;
            local_f8._8_4_ = 0xaaaaaaaa;
            local_f8._12_4_ = 0xaaaaaaaa;
            QOscMessage::QOscMessage((QOscMessage *)local_f8,&local_78);
            bVar6 = (bool)local_f8[0];
            if ((bool)local_f8[0] == true) {
              this->m_isValid = true;
              this->m_immediate = bVar8;
              this->m_timeEpoch = uVar12;
              this->m_timePico = uVar14;
              QtPrivate::QMovableArrayOps<QOscMessage>::emplace<QOscMessage_const&>
                        ((QMovableArrayOps<QOscMessage> *)&this->m_messages,
                         (this->m_messages).d.size,(QOscMessage *)local_f8);
              QList<QOscMessage>::end(&this->m_messages);
            }
            else {
              lcTuioBundle();
              if (((byte)lcTuioBundle::category.field_2.bools.enabledWarning._q_value._M_base._M_i &
                  1) != 0) {
                local_b8 = 2;
                uStack_b4 = 0;
                uStack_b0 = 0;
                uStack_ac = 0;
                LStack_a8 = ContainsBinary;
                uStack_a4 = 0;
                local_a0 = lcTuioBundle::category.name;
                QMessageLogger::warning((char *)&local_b8,"Invalid sub-message");
              }
            }
            pQVar16 = (QOscBundle *)&local_d8;
            QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)pQVar16);
            piVar4 = (int *)CONCAT44(local_f8._12_4_,local_f8._8_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                pQVar16 = (QOscBundle *)CONCAT44(local_f8._12_4_,local_f8._8_4_);
                QArrayData::deallocate((QArrayData *)pQVar16,1,0x10);
              }
            }
            if (bVar6 == false) {
LAB_00105d4d:
              if ((QOscBundle *)local_98.d.d != (QOscBundle *)0x0) {
                LOCK();
                *(int *)local_98.d.d = *(int *)local_98.d.d + -1;
                UNLOCK();
                if (*(int *)local_98.d.d == 0) {
                  QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
                }
              }
              if ((QOscBundle *)local_78.d.d != (QOscBundle *)0x0) {
                LOCK();
                *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
                UNLOCK();
                if (*(int *)local_78.d.d == 0) {
                  QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
                }
              }
              break;
            }
          }
          if ((QOscBundle *)local_98.d.d != (QOscBundle *)0x0) {
            LOCK();
            *(int *)local_98.d.d = *(int *)local_98.d.d + -1;
            UNLOCK();
            if (*(int *)local_98.d.d == 0) {
              pQVar16 = (QOscBundle *)local_98.d.d;
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
            }
          }
          if ((QOscBundle *)local_78.d.d != (QOscBundle *)0x0) {
            LOCK();
            *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
            UNLOCK();
            if (*(int *)local_78.d.d == 0) {
              pQVar16 = (QOscBundle *)local_78.d.d;
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
            }
          }
          uVar18 = uVar18 + 4 + uVar17;
          lVar11 = (data->d).size;
          if ((uint)lVar11 <= uVar18) break;
        }
      }
    }
  }
  if ((QArrayData *)local_58.stream != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.stream = *(int *)local_58.stream + -1;
    UNLOCK();
    if (*(int *)local_58.stream == 0) {
      QArrayData::deallocate((QArrayData *)local_58.stream,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QOscBundle::QOscBundle(const QByteArray &data)
    : m_isValid(false)
    , m_immediate(false)
    , m_timeEpoch(0)
    , m_timePico(0)
{
    // 8  16 24 32 40 48 56 64
    // #  b  u  n  d  l  e  \0
    // 23 62 75 6e 64 6c 65 00 // OSC string bundle identifier
    // 00 00 00 00 00 00 00 01 // osc time-tag, "immediately"
    // 00 00 00 30 // element length
    //      => message or bundle(s), preceded by length each time
    qCDebug(lcTuioBundle) << data.toHex();
    quint32 parsedBytes = 0;

    // "An OSC Bundle consists of the OSC-string "#bundle""
    QByteArray identifier;
    if (!qt_readOscString(data, identifier, parsedBytes) || identifier != "#bundle")
        return;

    // "followed by an OSC Time
    // Tag, followed by zero or more OSC Bundle Elements. The OSC-timetag is a
    // 64-bit fixed point time tag whose semantics are described below."
    if (parsedBytes > (quint32)data.size() || data.size() - parsedBytes < qsizetype(sizeof(quint64)))
        return;

    // "Time tags are represented by a 64 bit fixed point number. The first 32
    // bits specify the number of seconds since midnight on January 1,  1900,
    // and the last 32 bits specify fractional parts of a second to a precision
    // of about 200 picoseconds. This is the representation used by Internet NTP
    // timestamps."
    //
    // (editor's note: one may wonder how a 64bit big-endian number can also be
    // two 32bit numbers, without specifying in which order they occur or
    // anything, and one may indeed continue to wonder.)
    quint32 oscTimeEpoch = qFromBigEndian<quint32>(data.constData() + parsedBytes);
    parsedBytes += sizeof(quint32);
    quint32 oscTimePico = qFromBigEndian<quint32>(data.constData() + parsedBytes);
    parsedBytes += sizeof(quint32);

    bool isImmediate = false;

    if (oscTimeEpoch == 0 && oscTimePico == 1) {
        // "The time tag value consisting of 63 zero bits followed by a
        // one in the least significant bit is a special case meaning
        // "immediately.""
        isImmediate = true;
    }

    while (parsedBytes < (quint32)data.size()) {
        // "An OSC Bundle Element consists of its size and its contents. The size is an
        // int32 representing the number of 8-bit bytes in the contents, and will
        // always be a multiple of 4."
        //
        // in practice, a bundle can contain multiple bundles or messages,
        // though, and each is prefixed by a size.
        if (data.size() - parsedBytes < qsizetype(sizeof(quint32)))
            return;

        quint32 size = qFromBigEndian<quint32>((const uchar*)data.constData() + parsedBytes);
        parsedBytes += sizeof(quint32);

        if (data.size() - parsedBytes < size)
            return;

        if (size == 0) {
            // empty bundle; these are valid, but should they be allowed? the
            // spec is unclear on this...
            qCWarning(lcTuioBundle, "Empty bundle?");
            m_isValid = true;
            m_immediate = isImmediate;
            m_timeEpoch = oscTimeEpoch;
            m_timePico = oscTimePico;
            return;
        }

        // "The contents are either an OSC Message or an OSC Bundle.
        // Note this recursive definition: bundle may contain bundles."
        QByteArray subdata = data.mid(parsedBytes, size);
        parsedBytes += size;

        // "The contents of an OSC packet must be either an OSC Message or an OSC Bundle.
        // The first byte of the packet's contents unambiguously distinguishes between
        // these two alternatives."
        //
        // we're not dealing with a packet here, but the same trick works just
        // the same.
        QByteArray bundleIdentifier = QByteArray("#bundle\0",  8);
        if (subdata.startsWith('/')) {
            // starts with / => address pattern => start of a message
            QOscMessage subMessage(subdata);
            if (subMessage.isValid()) {
                m_isValid = true;
                m_immediate = isImmediate;
                m_timeEpoch = oscTimeEpoch;
                m_timePico = oscTimePico;
                m_messages.append(subMessage);
            } else {
                qCWarning(lcTuioBundle, "Invalid sub-message");
                return;
            }
        } else if (subdata.startsWith(bundleIdentifier)) {
            // bundle identifier start => bundle
            QOscBundle subBundle(subdata);
            if (subBundle.isValid()) {
                m_isValid = true;
                m_immediate = isImmediate;
                m_timeEpoch = oscTimeEpoch;
                m_timePico = oscTimePico;
                m_bundles.append(subBundle);
            }
        } else {
            qCWarning(lcTuioBundle, "Malformed sub-data!");
            return;
        }
    }
}